

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

void __thiscall QAccessibleToolButton::doAction(QAccessibleToolButton *this,QString *actionName)

{
  long lVar1;
  char cVar2;
  ToolButtonPopupMode TVar3;
  QWidget *pQVar4;
  long lVar5;
  QAbstractButton *pQVar6;
  QToolButton *pQVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  
  pQVar4 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  if ((pQVar4->data->widget_attributes & 1) != 0) {
    return;
  }
  lVar5 = QAccessibleActionInterface::pressAction();
  lVar1 = (actionName->d).size;
  if ((lVar1 == *(long *)(lVar5 + 0x10)) &&
     (QVar8.m_data = *(storage_type_conflict **)(lVar5 + 8), QVar8.m_size = lVar1,
     QVar10.m_data = (actionName->d).ptr, QVar10.m_size = lVar1,
     cVar2 = QtPrivate::equalStrings(QVar10,QVar8), cVar2 != '\0')) {
    (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))(this);
    pQVar6 = (QAbstractButton *)QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
    QAbstractButton::click(pQVar6);
    return;
  }
  lVar5 = QAccessibleActionInterface::showMenuAction();
  lVar1 = (actionName->d).size;
  if ((lVar1 == *(long *)(lVar5 + 0x10)) &&
     (QVar9.m_data = *(storage_type_conflict **)(lVar5 + 8), QVar9.m_size = lVar1,
     QVar11.m_data = (actionName->d).ptr, QVar11.m_size = lVar1,
     cVar2 = QtPrivate::equalStrings(QVar11,QVar9), cVar2 != '\0')) {
    (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))(this);
    pQVar7 = (QToolButton *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
    TVar3 = QToolButton::popupMode(pQVar7);
    if (TVar3 == InstantPopup) {
      return;
    }
    (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))(this);
    pQVar6 = (QAbstractButton *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
    QAbstractButton::setDown(pQVar6,true);
    (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))(this);
    pQVar7 = (QToolButton *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
    QToolButton::showMenu(pQVar7);
    return;
  }
  QAccessibleButton::doAction(&this->super_QAccessibleButton,actionName);
  return;
}

Assistant:

void QAccessibleToolButton::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == pressAction()) {
        button()->click();
    } else if (actionName == showMenuAction()) {
#if QT_CONFIG(menu)
        if (toolButton()->popupMode() != QToolButton::InstantPopup) {
            toolButton()->setDown(true);
            toolButton()->showMenu();
        }
#endif
    } else {
        QAccessibleButton::doAction(actionName);
    }

}